

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O0

int AF_A_CheckForReload(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  DObject *this;
  DObject *this_00;
  void *val;
  AWeapon *this_01;
  bool bVar1;
  bool local_82;
  bool local_7f;
  int local_7c;
  int ReloadCounter;
  AWeapon *weapon;
  bool dontincrement;
  FState *jump;
  int count;
  FState *state;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x1206,"int AF_A_CheckForReload(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                 );
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar1) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x1206,"int AF_A_CheckForReload(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                 );
  }
  this = (DObject *)(param->field_0).field_1.a;
  local_7f = true;
  if (this != (DObject *)0x0) {
    local_7f = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
  }
  if (local_7f == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x1206,"int AF_A_CheckForReload(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                 );
  }
  if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
    bVar1 = false;
    if ((param[1].field_0.field_3.Type == '\x03') &&
       (bVar1 = true, param[1].field_0.field_1.atag != 1)) {
      bVar1 = param[1].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar1) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x1206,
                    "int AF_A_CheckForReload(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    this_00 = (DObject *)param[1].field_0.field_1.a;
    local_82 = true;
    if (this_00 != (DObject *)0x0) {
      local_82 = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
    }
    if (local_82 == false) {
      __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x1206,
                    "int AF_A_CheckForReload(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  if ((2 < numparam) && (param[2].field_0.field_3.Type != 0xff)) {
    bVar1 = false;
    if ((param[2].field_0.field_3.Type == '\x03') &&
       (bVar1 = true, param[2].field_0.field_1.atag != 8)) {
      bVar1 = param[2].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar1) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x1206,
                    "int AF_A_CheckForReload(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  if ((*(long *)&this[0xc].ObjectFlags == 0) ||
     (*(long *)(*(long *)&this[0xc].ObjectFlags + 0xd0) == 0)) {
    if (numret < 1) {
      stack_local._4_4_ = 0;
    }
    else {
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x120a,
                      "int AF_A_CheckForReload(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      VMReturn::SetPointer(ret,(void *)0x0,7);
      stack_local._4_4_ = 1;
    }
  }
  else {
    if (numparam < 4) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x120c,
                    "int AF_A_CheckForReload(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    if (param[3].field_0.field_3.Type != '\0') {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x120c,
                    "int AF_A_CheckForReload(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    local_7c = param[3].field_0.i;
    if (numparam < 5) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x120d,
                    "int AF_A_CheckForReload(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    bVar1 = false;
    if ((param[4].field_0.field_3.Type == '\x03') &&
       (bVar1 = true, param[4].field_0.field_1.atag != 7)) {
      bVar1 = param[4].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar1) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATE || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x120d,
                    "int AF_A_CheckForReload(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    val = param[4].field_0.field_1.a;
    if ((numparam < 6) || (param[5].field_0.field_3.Type == 0xff)) {
      bVar1 = false;
    }
    else {
      if (param[5].field_0.field_3.Type != '\0') {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x120e,
                      "int AF_A_CheckForReload(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      bVar1 = param[5].field_0.i != 0;
    }
    self._4_4_ = numret;
    if (0 < numret) {
      VMReturn::SetPointer(ret,(void *)0x0,7);
      self._4_4_ = 1;
    }
    this_01 = *(AWeapon **)(*(long *)&this[0xc].ObjectFlags + 0xd0);
    if ((bVar1) && (this_01->ReloadCounter == 0)) {
      local_7c = 1;
    }
    else {
      local_7c = (this_01->ReloadCounter + 1) % local_7c;
    }
    if (local_7c == 0) {
      AWeapon::CheckAmmo(this_01,0,false,false,-1);
    }
    else if (self._4_4_ != 0) {
      VMReturn::SetPointer(ret,val,7);
    }
    if (!bVar1) {
      this_01->ReloadCounter = local_7c;
    }
    stack_local._4_4_ = self._4_4_;
  }
  return stack_local._4_4_;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_CheckForReload)
{
	PARAM_ACTION_PROLOGUE;

	if ( self->player == NULL || self->player->ReadyWeapon == NULL )
	{
		ACTION_RETURN_STATE(NULL);
	}
	PARAM_INT		(count);
	PARAM_STATE		(jump);
	PARAM_BOOL_OPT	(dontincrement)		{ dontincrement = false; }

	if (numret > 0)
	{
		ret->SetPointer(NULL, ATAG_STATE);
		numret = 1;
	}

	AWeapon *weapon = self->player->ReadyWeapon;

	int ReloadCounter = weapon->ReloadCounter;
	if (!dontincrement || ReloadCounter != 0)
		ReloadCounter = (weapon->ReloadCounter+1) % count;
	else // 0 % 1 = 1?  So how do we check if the weapon was never fired?  We should only do this when we're not incrementing the counter though.
		ReloadCounter = 1;

	// If we have not made our last shot...
	if (ReloadCounter != 0)
	{
		// Go back to the refire frames, instead of continuing on to the reload frames.
		if (numret != 0)
		{
			ret->SetPointer(jump, ATAG_STATE);
		}
	}
	else
	{
		// We need to reload. However, don't reload if we're out of ammo.
		weapon->CheckAmmo(false, false);
	}
	if (!dontincrement)
	{
		weapon->ReloadCounter = ReloadCounter;
	}
	return numret;
}